

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

ostream * operator<<(ostream *os,S2LatLngRect *r)

{
  ostream *poVar1;
  S2LatLng local_28;
  S2LatLng local_18;
  
  poVar1 = std::operator<<(os,"[Lo");
  local_18.coords_.c_[0] = (r->lat_).bounds_.c_[0];
  local_18.coords_.c_[1] = (r->lng_).bounds_.c_[0];
  poVar1 = operator<<(poVar1,&local_18);
  poVar1 = std::operator<<(poVar1,", Hi");
  local_28.coords_.c_[0] = (r->lat_).bounds_.c_[1];
  local_28.coords_.c_[1] = (r->lng_).bounds_.c_[1];
  poVar1 = operator<<(poVar1,&local_28);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const S2LatLngRect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}